

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_render.h
# Opt level: O0

void embree::renderBenchmarkLegacy<embree::Tutorial>
               (BenchState *state,BenchParams *params,int argc,char **argv)

{
  _Setw _Var1;
  ulong uVar2;
  ostream *poVar3;
  void *pvVar4;
  int *in_RSI;
  float fVar5;
  float fVar6;
  double dVar7;
  double rate;
  double rate_1;
  float mrayps;
  float fps;
  double dt_1;
  double t1_1;
  double t0_1;
  size_t i_1;
  double dt;
  double t1;
  double t0;
  size_t i;
  size_t numTotalFrames;
  FilteredStatistics mraypsStat;
  FilteredStatistics fpsStat;
  IOStreamStateRestorer cout_state;
  ISPCCamera ispccamera;
  Tutorial tutorial;
  ostream *in_stack_fffffffffffff608;
  uint in_stack_fffffffffffff610;
  uint in_stack_fffffffffffff614;
  uint *in_stack_fffffffffffff618;
  TutorialApplication *in_stack_fffffffffffff620;
  float in_stack_fffffffffffff628;
  float in_stack_fffffffffffff62c;
  FilteredStatistics *in_stack_fffffffffffff630;
  float in_stack_fffffffffffff6bc;
  FilteredStatistics *in_stack_fffffffffffff6c0;
  Tutorial *in_stack_fffffffffffff770;
  undefined4 in_stack_fffffffffffff778;
  undefined4 in_stack_fffffffffffff77c;
  size_t in_stack_fffffffffffff780;
  undefined4 in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff78c;
  double local_5d0;
  double local_5a8;
  double local_598;
  ulong local_580;
  double local_568;
  ulong local_550;
  float local_478;
  char **in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  SceneLoadingTutorialApplication *in_stack_ffffffffffffff50;
  
  Tutorial::Tutorial(in_stack_fffffffffffff770);
  SceneLoadingTutorialApplication::main
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
  TutorialApplication::resize
            ((TutorialApplication *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             (uint)((ulong)in_stack_fffffffffffff608 >> 0x20),(uint)in_stack_fffffffffffff608);
  Camera::getISPCCamera
            ((Camera *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
             in_stack_fffffffffffff780,CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778)
            );
  IOStreamStateRestorer::IOStreamStateRestorer
            ((IOStreamStateRestorer *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             in_stack_fffffffffffff608);
  std::ios_base::setf((ios_base *)in_stack_fffffffffffff620,
                      (fmtflags)((ulong)in_stack_fffffffffffff618 >> 0x20),
                      (fmtflags)in_stack_fffffffffffff618);
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),4);
  FilteredStatistics::FilteredStatistics
            (in_stack_fffffffffffff630,in_stack_fffffffffffff62c,in_stack_fffffffffffff628);
  FilteredStatistics::FilteredStatistics
            (in_stack_fffffffffffff630,in_stack_fffffffffffff62c,in_stack_fffffffffffff628);
  uVar2 = (ulong)(*in_RSI + in_RSI[1]);
  for (local_550 = 0; local_550 < (ulong)(long)*in_RSI; local_550 = local_550 + 1) {
    TutorialApplication::initRayStats
              ((TutorialApplication *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610))
    ;
    dVar7 = getSeconds();
    TutorialApplication::render
              (in_stack_fffffffffffff620,in_stack_fffffffffffff618,in_stack_fffffffffffff614,
               in_stack_fffffffffffff610,(float)((ulong)in_stack_fffffffffffff608 >> 0x20),
               (ISPCCamera *)0x11bda6);
    local_568 = getSeconds();
    local_568 = local_568 - dVar7;
    if ((local_478 != 0.0) || (NAN(local_478))) {
      local_568 = (double)local_478;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"frame [");
    _Var1 = std::setw(3);
    poVar3 = std::operator<<(poVar3,_Var1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_550);
    poVar3 = std::operator<<(poVar3," / ");
    _Var1 = std::setw(3);
    poVar3 = std::operator<<(poVar3,_Var1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
    poVar3 = std::operator<<(poVar3,"]: ");
    _Var1 = std::setw(8);
    poVar3 = std::operator<<(poVar3,_Var1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1.0 / local_568);
    poVar3 = std::operator<<(poVar3," fps (skipped)");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
  }
  for (local_580 = (ulong)*in_RSI; local_580 < uVar2; local_580 = local_580 + 1) {
    TutorialApplication::initRayStats
              ((TutorialApplication *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610))
    ;
    dVar7 = getSeconds();
    TutorialApplication::render
              (in_stack_fffffffffffff620,in_stack_fffffffffffff618,in_stack_fffffffffffff614,
               in_stack_fffffffffffff610,(float)((ulong)in_stack_fffffffffffff608 >> 0x20),
               (ISPCCamera *)0x11c100);
    local_598 = getSeconds();
    local_598 = local_598 - dVar7;
    if ((local_478 != 0.0) || (NAN(local_478))) {
      local_598 = (double)local_478;
    }
    FilteredStatistics::add(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
    TutorialApplication::getNumRays(in_stack_fffffffffffff620);
    FilteredStatistics::add(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
    if ((0x3ff < uVar2) && ((local_580 & 0x3f) == 0)) {
      local_5a8 = 0.0;
      fVar5 = FilteredStatistics::getAvg((FilteredStatistics *)0x11c24c);
      if ((fVar5 != 0.0) || (NAN(fVar5))) {
        fVar5 = FilteredStatistics::getSigma((FilteredStatistics *)0x11c279);
        fVar6 = FilteredStatistics::getAvg((FilteredStatistics *)0x11c2af);
        local_5a8 = (double)((fVar5 * 100.0) / fVar6);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"frame [");
      _Var1 = std::setw(3);
      poVar3 = std::operator<<(poVar3,_Var1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_580);
      poVar3 = std::operator<<(poVar3," / ");
      _Var1 = std::setw(3);
      poVar3 = std::operator<<(poVar3,_Var1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
      poVar3 = std::operator<<(poVar3,"]: ");
      _Var1 = std::setw(8);
      poVar3 = std::operator<<(poVar3,_Var1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(float)(1.0 / local_598));
      poVar3 = std::operator<<(poVar3," fps, ");
      poVar3 = std::operator<<(poVar3,"min = ");
      _Var1 = std::setw(8);
      poVar3 = std::operator<<(poVar3,_Var1);
      fVar5 = FilteredStatistics::getMin((FilteredStatistics *)0x11c4d9);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
      poVar3 = std::operator<<(poVar3," fps, ");
      poVar3 = std::operator<<(poVar3,"avg = ");
      _Var1 = std::setw(8);
      poVar3 = std::operator<<(poVar3,_Var1);
      fVar5 = FilteredStatistics::getAvg((FilteredStatistics *)0x11c58c);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
      poVar3 = std::operator<<(poVar3," fps, ");
      poVar3 = std::operator<<(poVar3,"max = ");
      _Var1 = std::setw(8);
      poVar3 = std::operator<<(poVar3,_Var1);
      fVar5 = FilteredStatistics::getMax((FilteredStatistics *)0x11c63f);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
      poVar3 = std::operator<<(poVar3," fps, ");
      poVar3 = std::operator<<(poVar3,"sigma = ");
      _Var1 = std::setw(6);
      poVar3 = std::operator<<(poVar3,_Var1);
      fVar5 = FilteredStatistics::getSigma((FilteredStatistics *)0x11c6f2);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
      poVar3 = std::operator<<(poVar3," (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_5a8);
      poVar3 = std::operator<<(poVar3,"%)");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
    }
  }
  local_5d0 = 0.0;
  fVar5 = FilteredStatistics::getAvg((FilteredStatistics *)0x11c7e3);
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    fVar5 = FilteredStatistics::getAvgSigma((FilteredStatistics *)0x11c810);
    fVar6 = FilteredStatistics::getAvg((FilteredStatistics *)0x11c846);
    local_5d0 = (double)((fVar5 * 100.0) / fVar6);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"frame [");
  _Var1 = std::setw(3);
  poVar3 = std::operator<<(poVar3,_Var1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*in_RSI);
  poVar3 = std::operator<<(poVar3," - ");
  _Var1 = std::setw(3);
  poVar3 = std::operator<<(poVar3,_Var1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
  poVar3 = std::operator<<(poVar3,"]: ");
  poVar3 = std::operator<<(poVar3,"              ");
  poVar3 = std::operator<<(poVar3,"min = ");
  _Var1 = std::setw(8);
  poVar3 = std::operator<<(poVar3,_Var1);
  fVar5 = FilteredStatistics::getMin((FilteredStatistics *)0x11ca13);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
  poVar3 = std::operator<<(poVar3," fps, ");
  poVar3 = std::operator<<(poVar3,"avg = ");
  _Var1 = std::setw(8);
  poVar3 = std::operator<<(poVar3,_Var1);
  fVar5 = FilteredStatistics::getAvg((FilteredStatistics *)0x11cac6);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
  poVar3 = std::operator<<(poVar3," fps, ");
  poVar3 = std::operator<<(poVar3,"max = ");
  _Var1 = std::setw(8);
  poVar3 = std::operator<<(poVar3,_Var1);
  fVar5 = FilteredStatistics::getMax((FilteredStatistics *)0x11cb79);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
  poVar3 = std::operator<<(poVar3," fps, ");
  poVar3 = std::operator<<(poVar3,"sigma = ");
  _Var1 = std::setw(6);
  poVar3 = std::operator<<(poVar3,_Var1);
  fVar5 = FilteredStatistics::getAvgSigma((FilteredStatistics *)0x11cc2c);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
  poVar3 = std::operator<<(poVar3," (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_5d0);
  poVar3 = std::operator<<(poVar3,"%)");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_MIN ");
  fVar5 = FilteredStatistics::getMin((FilteredStatistics *)0x11ccf3);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,fVar5);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_AVG ");
  fVar5 = FilteredStatistics::getAvg((FilteredStatistics *)0x11cd5e);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,fVar5);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_MAX ");
  fVar5 = FilteredStatistics::getMax((FilteredStatistics *)0x11cdc9);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,fVar5);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_SIGMA ");
  fVar5 = FilteredStatistics::getSigma((FilteredStatistics *)0x11ce34);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,fVar5);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_AVG_SIGMA ");
  fVar5 = FilteredStatistics::getAvgSigma((FilteredStatistics *)0x11ce9f);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,fVar5);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_MRAYPS_MIN ");
  fVar5 = FilteredStatistics::getMin((FilteredStatistics *)0x11cf01);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,fVar5);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_MRAYPS_AVG ");
  fVar5 = FilteredStatistics::getAvg((FilteredStatistics *)0x11cf5a);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,fVar5);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_MRAYPS_MAX ");
  fVar5 = FilteredStatistics::getMax((FilteredStatistics *)0x11cfb3);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,fVar5);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_MRAYPS_SIGMA ");
  fVar5 = FilteredStatistics::getSigma((FilteredStatistics *)0x11d00c);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,fVar5);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_MRAYPS_AVG_SIGMA ");
  fVar5 = FilteredStatistics::getAvgSigma((FilteredStatistics *)0x11d065);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,fVar5);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::flush<char,std::char_traits<char>>);
  FilteredStatistics::~FilteredStatistics((FilteredStatistics *)0x11d0b7);
  FilteredStatistics::~FilteredStatistics((FilteredStatistics *)0x11d0c4);
  IOStreamStateRestorer::~IOStreamStateRestorer
            ((IOStreamStateRestorer *)CONCAT44(fVar5,in_stack_fffffffffffff610));
  Tutorial::~Tutorial((Tutorial *)0x11d0de);
  return;
}

Assistant:

static void renderBenchmarkLegacy(BenchState& state, BenchParams& params ,int argc, char** argv)
{
  Tutorial tutorial;
  tutorial.interactive = false;
  tutorial.main(argc,argv);

  tutorial.resize(tutorial.width, tutorial.height);
  ISPCCamera ispccamera = tutorial.camera.getISPCCamera(tutorial.width, tutorial.height);

  IOStreamStateRestorer cout_state(std::cout);
  std::cout.setf(std::ios::fixed, std::ios::floatfield);
  std::cout.precision(4);

  //Statistics stat;
  FilteredStatistics fpsStat(0.5f,0.0f);
  FilteredStatistics mraypsStat(0.5f,0.0f);
  {
    size_t numTotalFrames = params.skipIterations + params.minTimeOrIterations;
    for (size_t i=0; i<params.skipIterations; i++)
    {
      tutorial.initRayStats();
      double t0 = getSeconds();
      tutorial.render(tutorial.pixels,tutorial.width,tutorial.height,0.0f,ispccamera);
      double t1 = getSeconds();
      double dt = t1-t0;
      if (ispccamera.render_time != 0.0)
	dt = ispccamera.render_time;
      std::cout << "frame [" << std::setw(3) << i << " / " << std::setw(3) << numTotalFrames << "]: " <<  std::setw(8) << 1.0/dt << " fps (skipped)" << std::endl << std::flush;
    }

    for (size_t i=params.skipIterations; i<numTotalFrames; i++)
    {
      tutorial.initRayStats();
      double t0 = getSeconds();
      tutorial.render(tutorial.pixels,tutorial.width,tutorial.height,0.0f,ispccamera);
      double t1 = getSeconds();
      double dt = t1-t0;
      if (ispccamera.render_time != 0.0)
	dt = ispccamera.render_time;

      float fps = float(1.0/dt);
      fpsStat.add(fps);

      float mrayps = float(double(tutorial.getNumRays())/(1000000.0*dt));
      mraypsStat.add(mrayps);

      if (numTotalFrames >= 1024 && (i % 64 == 0))
      {
        double rate = 0;
        if (fpsStat.getAvg()) rate = 100.0f*fpsStat.getSigma()/fpsStat.getAvg();

        std::cout << "frame [" << std::setw(3) << i << " / " << std::setw(3) << numTotalFrames << "]: "
                  << std::setw(8) << fps << " fps, "
                  << "min = " << std::setw(8) << fpsStat.getMin() << " fps, "
                  << "avg = " << std::setw(8) << fpsStat.getAvg() << " fps, "
                  << "max = " << std::setw(8) << fpsStat.getMax() << " fps, "
                  << "sigma = " << std::setw(6) << fpsStat.getSigma() << " (" << rate << "%)" << std::endl << std::flush;
      }
    }

    double rate = 0;
    if (fpsStat.getAvg()) rate = 100.0f*fpsStat.getAvgSigma()/fpsStat.getAvg();

    std::cout << "frame [" << std::setw(3) << params.skipIterations << " - " << std::setw(3) << numTotalFrames << "]: "
              << "              "
              << "min = " << std::setw(8) << fpsStat.getMin() << " fps, "
              << "avg = " << std::setw(8) << fpsStat.getAvg() << " fps, "
              << "max = " << std::setw(8) << fpsStat.getMax() << " fps, "
              << "sigma = " << std::setw(6) << fpsStat.getAvgSigma() << " (" << rate << "%)" << std::endl;
  }

  std::cout << "BENCHMARK_RENDER_MIN " << fpsStat.getMin() << std::endl;
  std::cout << "BENCHMARK_RENDER_AVG " << fpsStat.getAvg() << std::endl;
  std::cout << "BENCHMARK_RENDER_MAX " << fpsStat.getMax() << std::endl;
  std::cout << "BENCHMARK_RENDER_SIGMA " << fpsStat.getSigma() << std::endl;
  std::cout << "BENCHMARK_RENDER_AVG_SIGMA " << fpsStat.getAvgSigma() << std::endl;

#if defined(RAY_STATS)
  std::cout << "BENCHMARK_RENDER_MRAYPS_MIN " << mraypsStat.getMin() << std::endl;
  std::cout << "BENCHMARK_RENDER_MRAYPS_AVG " << mraypsStat.getAvg() << std::endl;
  std::cout << "BENCHMARK_RENDER_MRAYPS_MAX " << mraypsStat.getMax() << std::endl;
  std::cout << "BENCHMARK_RENDER_MRAYPS_SIGMA " << mraypsStat.getSigma() << std::endl;
  std::cout << "BENCHMARK_RENDER_MRAYPS_AVG_SIGMA " << mraypsStat.getAvgSigma() << std::endl;
#endif

  std::cout << std::flush;
}